

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

void __thiscall mocker::ir::Builder::operator()(Builder *this)

{
  BreakStmt *in_RSI;
  
  operator()((Builder *)(&this->field_0x0 + *(long *)(*(long *)this + -0xa0)),in_RSI);
  return;
}

Assistant:

void Builder::operator()(const ast::BreakStmt &node) const {
  auto originBB = ctx.getCurBasicBlock();
  FunctionModule &func = ctx.getCurFunc();

  auto loopSuccessor = ctx.getCurLoopSuccessor();
  ctx.emplaceInst<Jump>(loopSuccessor);

  auto successorBB = func.insertBBAfter(originBB);
  ctx.setCurBasicBlock(successorBB);
}